

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgn.cpp
# Opt level: O0

bool __thiscall pgn::parse_files(pgn *this)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  reference this_00;
  char *pcVar4;
  istream *piVar5;
  ostream *poVar6;
  size_type sVar7;
  istringstream aiStack_24e60 [8];
  istringstream tmp;
  istringstream aiStack_24cd8 [7];
  bool success;
  istringstream fen;
  undefined1 auStack_24b58 [8];
  position p;
  game g;
  string line;
  istream local_240 [8];
  ifstream pgn_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *f;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  size_t fcount;
  pgn *this_local;
  
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->pgn_files);
  f = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(&this->pgn_files);
  while (bVar1 = __gnu_cxx::
                 operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&f), ((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end1);
    poVar6 = std::operator<<((ostream *)&std::cout,"..parsing games from ");
    poVar6 = std::operator<<(poVar6,(string *)this_00);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (this_00);
    std::ifstream::ifstream(local_240,pcVar4,_S_in);
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"..failed to open pgn file, skipping");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    else {
      std::__cxx11::string::string
                ((string *)
                 &g.moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      game::game((game *)&p.root_moves.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      position::position((position *)auStack_24b58);
      std::__cxx11::istringstream::istringstream
                (aiStack_24cd8,(string *)&START_FEN_abi_cxx11_,_S_in);
      position::setup((position *)auStack_24b58,(istringstream *)aiStack_24cd8);
      bVar1 = true;
      while( true ) {
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           (local_240,
                            (string *)
                            &g.moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
        bVar3 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
        if (!bVar3) break;
        bVar3 = is_empty(this,(string *)
                              &g.moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
        if ((bVar3) ||
           (bVar3 = is_header(this,(string *)
                                   &g.moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage), bVar3)) {
          bVar3 = is_elo(this,(string *)
                              &g.moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
          if (bVar3) {
            parse_elo(this,(game *)&p.root_moves.
                                    super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,
                      (string *)
                      &g.moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
          }
        }
        else {
          bVar3 = parse_moves(this,(position *)auStack_24b58,
                              (string *)
                              &g.moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (game *)&p.root_moves.
                                       super__Vector_base<Rootmove,_std::allocator<Rootmove>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar3) {
            bVar3 = game::finished((game *)&p.root_moves.
                                            super__Vector_base<Rootmove,_std::allocator<Rootmove>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage);
            if (bVar3) {
              if (bVar1) {
                std::vector<game,_std::allocator<game>_>::push_back
                          (&this->games,
                           (value_type *)
                           &p.root_moves.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              game::clear((game *)&p.root_moves.
                                   super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
              position::clear((position *)auStack_24b58);
              std::__cxx11::istringstream::istringstream
                        (aiStack_24e60,(string *)&START_FEN_abi_cxx11_,_S_in);
              position::setup((position *)auStack_24b58,(istringstream *)aiStack_24e60);
              bVar1 = true;
              std::__cxx11::istringstream::~istringstream(aiStack_24e60);
            }
          }
          else {
            poVar6 = std::operator<<((ostream *)&std::cout,"..error parsing line: ");
            poVar6 = std::operator<<(poVar6,(string *)
                                            &g.moves.super__Vector_base<Move,_std::allocator<Move>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            poVar6 = std::operator<<((ostream *)&std::cout,"..from file ");
            poVar6 = std::operator<<(poVar6,(string *)this_00);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            bVar1 = false;
          }
        }
      }
      std::ifstream::close();
      std::__cxx11::istringstream::~istringstream(aiStack_24cd8);
      position::~position((position *)auStack_24b58);
      game::~game((game *)&p.root_moves.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &g.moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    std::ifstream::~ifstream(local_240);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"..parsed ");
  sVar7 = std::vector<game,_std::allocator<game>_>::size(&this->games);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar7);
  poVar6 = std::operator<<(poVar6," chess games.");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  return true;
}

Assistant:

bool pgn::parse_files() {

	size_t fcount = 0;
	for (const auto& f : pgn_files) {

		std::cout << "..parsing games from " << f << std::endl;

		std::ifstream pgn_file(f.c_str(), std::fstream::in);


		if (!pgn_file.is_open()) {
			std::cout << "..failed to open pgn file, skipping" << std::endl;
			continue;
		}

		std::string line;
		game g;

		position p;
		std::istringstream fen(START_FEN);
		p.setup(fen); // start position for each game
		bool success = true;

		while (std::getline(pgn_file, line)) {

			if (is_empty(line) || is_header(line)) {
				if (is_elo(line)) parse_elo(g, line);
				continue;
			}

			if (!parse_moves(p, line, g)) {
				std::cout << "..error parsing line: " << line << std::endl;
				std::cout << "..from file " << f << std::endl;
				success = false;
				continue;
			}

			if (g.finished()) {
				if (success) games.push_back(g);
				g.clear();
				p.clear();
				std::istringstream tmp(START_FEN);
				p.setup(tmp);
				success = true;
			}
		}

		++fcount;
		pgn_file.close();

	}
	std::cout << "..parsed " << games.size() << " chess games." << std::endl;

	return true;
}